

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
__thiscall
duckdb::Connection::PendingQuery
          (Connection *this,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement,case_insensitive_map_t<BoundParameterData> *named_values,
          bool allow_stream_result)

{
  ClientContext *statement_00;
  pointer *__ptr;
  __buckets_ptr local_28;
  
  statement_00 = shared_ptr<duckdb::ClientContext,_true>::operator->
                           ((shared_ptr<duckdb::ClientContext,_true> *)statement);
  local_28 = (named_values->_M_h)._M_buckets;
  (named_values->_M_h)._M_buckets = (__buckets_ptr)0x0;
  ClientContext::PendingQuery
            ((ClientContext *)this,
             (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             statement_00,(case_insensitive_map_t<BoundParameterData> *)&stack0xffffffffffffffd8,
             allow_stream_result);
  if (local_28 != (__buckets_ptr)0x0) {
    (*(code *)(*local_28)[1]._M_nxt)();
  }
  return (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         this;
}

Assistant:

unique_ptr<PendingQueryResult> Connection::PendingQuery(unique_ptr<SQLStatement> statement,
                                                        case_insensitive_map_t<BoundParameterData> &named_values,
                                                        bool allow_stream_result) {
	return context->PendingQuery(std::move(statement), named_values, allow_stream_result);
}